

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yang.c
# Opt level: O0

void yang_print_typedef(lyout *out,int level,lys_module *module,lys_tpdf *tpdf)

{
  char *__s2;
  ly_ctx *ctx;
  int level_00;
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  char *local_30;
  char *dflt;
  lys_tpdf *tpdf_local;
  lys_module *module_local;
  int level_local;
  lyout *out_local;
  
  ly_print(out,"%*stypedef %s {\n",(ulong)(uint)(level << 1),"",tpdf->name);
  level_00 = level + 1;
  yang_print_snode_common(out,level_00,(lys_node *)tpdf,module,(int *)0x0,1);
  yang_print_type(out,level_00,module,&tpdf->type);
  if (tpdf->units != (char *)0x0) {
    yang_print_substmt(out,level_00,LYEXT_SUBSTMT_UNITS,'\0',tpdf->units,module,tpdf->ext,
                       (uint)tpdf->ext_size);
  }
  if (tpdf->dflt != (char *)0x0) {
    if ((tpdf->flags & 0x800) == 0) {
      local_30 = tpdf->dflt;
    }
    else {
      pcVar2 = strchr(tpdf->dflt,0x3a);
      if (pcVar2 == (char *)0x0) {
        __assert_fail("strchr(tpdf->dflt, \':\')",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/printer_yang.c"
                      ,0x374,
                      "void yang_print_typedef(struct lyout *, int, const struct lys_module *, const struct lys_tpdf *)"
                     );
      }
      pcVar2 = tpdf->dflt;
      __s2 = module->name;
      pcVar3 = strchr(tpdf->dflt,0x3a);
      iVar1 = strncmp(pcVar2,__s2,(long)pcVar3 - (long)tpdf->dflt);
      if (iVar1 == 0) {
        ctx = module->ctx;
        pcVar2 = strchr(tpdf->dflt,0x3a);
        local_30 = lydict_insert(ctx,pcVar2 + 1,0);
      }
      else {
        local_30 = transform_json2schema(module,tpdf->dflt);
      }
    }
    yang_print_substmt(out,level_00,LYEXT_SUBSTMT_DEFAULT,'\0',local_30,module,tpdf->ext,
                       (uint)tpdf->ext_size);
    if ((tpdf->flags & 0x800) != 0) {
      lydict_remove(module->ctx,local_30);
    }
  }
  yang_print_snode_common(out,level_00,(lys_node *)tpdf,module,(int *)0x0,0x70);
  ly_print(out,"%*s}\n",(ulong)(uint)(level << 1),"");
  return;
}

Assistant:

static void
yang_print_typedef(struct lyout *out, int level, const struct lys_module *module, const struct lys_tpdf *tpdf)
{
    const char *dflt;

    ly_print(out, "%*stypedef %s {\n", LEVEL, INDENT, tpdf->name);
    level++;

    yang_print_snode_common(out, level, (struct lys_node *)tpdf, module, NULL, SNODE_COMMON_EXT);
    yang_print_type(out, level, module, &tpdf->type);
    if (tpdf->units != NULL) {
        yang_print_substmt(out, level, LYEXT_SUBSTMT_UNITS, 0, tpdf->units, module, tpdf->ext, tpdf->ext_size);
    }
    if (tpdf->dflt != NULL) {
        if (tpdf->flags & LYS_DFLTJSON) {
            assert(strchr(tpdf->dflt, ':'));
            if (!strncmp(tpdf->dflt, module->name, strchr(tpdf->dflt, ':') - tpdf->dflt)) {
                /* local module */
                dflt = lydict_insert(module->ctx, strchr(tpdf->dflt, ':') + 1, 0);
            } else {
                dflt = transform_json2schema(module, tpdf->dflt);
            }
        } else {
            dflt = tpdf->dflt;
        }
        yang_print_substmt(out, level, LYEXT_SUBSTMT_DEFAULT, 0, dflt, module, tpdf->ext, tpdf->ext_size);
        if (tpdf->flags & LYS_DFLTJSON) {
            lydict_remove(module->ctx, dflt);
        }
    }
    yang_print_snode_common(out, level, (struct lys_node *)tpdf, module, NULL,
                            SNODE_COMMON_STATUS | SNODE_COMMON_DSC | SNODE_COMMON_REF);

    level--;
    ly_print(out, "%*s}\n", LEVEL, INDENT);
}